

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O0

LinearObjBuilder __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
          (BasicProblem<mp::BasicProblemParams<int>_> *this,Type type,NumericExpr expr,
          int num_linear_terms)

{
  reference expr_00;
  SafeBool SVar1;
  LinearExpr *in_RDI;
  LinearExpr *linear_expr;
  value_type *in_stack_ffffffffffffff28;
  BasicProblem<mp::BasicProblemParams<int>_> *this_00;
  ExprBase expr_01;
  Impl local_98 [9];
  bool in_stack_ffffffffffffff8f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  ExprBase local_10;
  LinearExprBuilder local_8;
  
  std::vector<bool,_std::allocator<bool>_>::push_back
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  this_00 = (BasicProblem<mp::BasicProblemParams<int>_> *)
            &in_RDI[4].terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
             m_data.m_storage;
  expr_01.impl_ = local_98;
  LinearExpr::LinearExpr((LinearExpr *)0x6b9b2c);
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::push_back
            ((vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *)in_RDI,
             in_stack_ffffffffffffff28);
  LinearExpr::~LinearExpr((LinearExpr *)0x6b9b47);
  expr_00 = std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::back
                      ((vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *)in_RDI);
  LinearExpr::Reserve(in_RDI,(size_t)in_stack_ffffffffffffff28);
  SVar1 = internal::ExprBase::operator_cast_to_function_pointer(&local_10);
  if (SVar1 != 0) {
    std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::size
              ((vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *)
               &in_RDI[4].terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
                m_data.m_storage);
    SetNonlinearObjExpr(this_00,(int)((ulong)in_RDI >> 0x20),(NumericExpr)expr_01.impl_);
  }
  LinearExprBuilder::LinearExprBuilder(&local_8,expr_00);
  return (LinearObjBuilder)local_8.expr_;
}

Assistant:

typename BasicProblem<Alloc>::LinearObjBuilder BasicProblem<Alloc>::AddObj(
    obj::Type type, NumericExpr expr, int num_linear_terms) {
  MP_ASSERT(linear_objs_.size() < MP_MAX_PROBLEM_ITEMS, "too many objectives");
  is_obj_max_.push_back(type != obj::MIN);
  linear_objs_.push_back(LinearExpr());
  LinearExpr &linear_expr = linear_objs_.back();
  linear_expr.Reserve(num_linear_terms);
  if (expr)
    SetNonlinearObjExpr(static_cast<int>(linear_objs_.size() - 1), expr);
  return LinearObjBuilder(&linear_expr);
}